

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O2

int areadint(char *file,int **data_ref,int *length_ref)

{
  int __fd;
  ssize_t sVar1;
  int *__buf;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  char *__format;
  uint uVar6;
  uint local_3c;
  uint *local_38;
  
  __fd = open(file,0,0x1a4);
  if (__fd < 0) {
    fprintf(_stderr,"areadint: %s: can\'t open\n",file);
  }
  else {
    sVar1 = read(__fd,&local_3c,4);
    if (sVar1 == 4) {
      uVar6 = local_3c >> 0x18 | (local_3c & 0xff0000) >> 8 | (local_3c & 0xff00) << 8 |
              local_3c << 0x18;
      if (data_ref == (int **)0x0) {
        close(__fd);
        if (length_ref != (int *)0x0) {
          *length_ref = uVar6;
          return uVar6;
        }
        return uVar6;
      }
      uVar5 = uVar6 * 4;
      local_38 = (uint *)length_ref;
      __buf = (int *)malloc((ulong)uVar5);
      if (__buf != (int *)0x0) {
        sVar2 = read(__fd,__buf,(long)(int)uVar5);
        if (sVar2 != (long)(int)uVar5) {
          fprintf(_stderr,"areadint: %s: can\'t read data\n",file);
          close(__fd);
          free(__buf);
          return -1;
        }
        close(__fd);
        *data_ref = __buf;
        uVar3 = 0;
        uVar4 = 0;
        if (0 < (int)uVar6) {
          uVar4 = (ulong)uVar6;
        }
        for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
          uVar5 = __buf[uVar3];
          __buf[uVar3] = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                         uVar5 << 0x18;
        }
        *local_38 = uVar6;
        return uVar6;
      }
      __format = "areadint: %s: can\'t alloc data\n";
    }
    else {
      __format = "areadint: %s: can\'t read length (empty file?)\n";
    }
    fprintf(_stderr,__format,file);
    close(__fd);
  }
  return -1;
}

Assistant:

int
areadint (char *file,
	  int **data_ref,
	  int *length_ref)
{
  int             fd;
  int             length;
  int             size;
  int             offset;
  char           *data;

  if ((fd = open (file, O_RDONLY | O_BINARY, 0644)) < 0)
  {
    fprintf (stderr, "areadint: %s: can't open\n", file);
    return -1;
  }
  if (read (fd, (char *) &length, 4) != 4)
  {
    fprintf (stderr, "areadint: %s: can't read length (empty file?)\n", file);
    close (fd);
    return -1;
  }
  SWAP_INT32(&length);
  /* Just get the file size if we were not given a buffer. */
  if (data_ref == NULL) {
	  close(fd);
	  if (length_ref)
	    *length_ref = length;
	  return length;
  }
  size = length * sizeof (int);
  if (!(data = malloc ((unsigned) size)))
  {
    fprintf (stderr, "areadint: %s: can't alloc data\n", file);
    close (fd);
    return -1;
  }
  if (read (fd, data, size) != size)
  {
    fprintf (stderr, "areadint: %s: can't read data\n", file);
    close (fd);
    free (data);
    return -1;
  }
  close (fd);
  *data_ref = (int *) data;
  for(offset = 0; offset < length; offset++)
    SWAP_INT32(*data_ref + offset);
  *length_ref = length;
  return length;
}